

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O0

Abc_Ntk_t * Io_ReadEqn(char *pFileName,int fCheck)

{
  int iVar1;
  Extra_FileReader_t *p_00;
  Abc_Ntk_t *pNtk;
  Extra_FileReader_t *p;
  int fCheck_local;
  char *pFileName_local;
  
  p_00 = Extra_FileReaderAlloc(pFileName,"#",";","=");
  if (p_00 == (Extra_FileReader_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)Io_ReadEqnNetwork(p_00);
    Extra_FileReaderFree(p_00);
    if ((Abc_Ntk_t *)pFileName_local == (Abc_Ntk_t *)0x0) {
      pFileName_local = (char *)0x0;
    }
    else if ((fCheck != 0) && (iVar1 = Abc_NtkCheckRead((Abc_Ntk_t *)pFileName_local), iVar1 == 0))
    {
      printf("Io_ReadEqn: The network check has failed.\n");
      Abc_NtkDelete((Abc_Ntk_t *)pFileName_local);
      pFileName_local = (char *)0x0;
    }
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

Abc_Ntk_t * Io_ReadEqn( char * pFileName, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", ";", "=" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadEqnNetwork( p );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadEqn: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}